

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::AddTargetDepends
          (cmGlobalGenerator *this,cmGeneratorTarget *target,TargetDependSet *projectTargets)

{
  mapped_type *pmVar1;
  _Rb_tree_node_base *p_Var2;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar3;
  cmTargetDepend local_30;
  
  local_30.Link = false;
  local_30.Util = false;
  local_30.Target = target;
  pVar3 = std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)projectTargets,&local_30);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_30.Target = target;
    pmVar1 = std::
             map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,&local_30.Target);
    for (p_Var2 = (pmVar1->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(pmVar1->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      AddTargetDepends(this,*(cmGeneratorTarget **)(p_Var2 + 1),projectTargets);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddTargetDepends(cmGeneratorTarget const* target,
                                         TargetDependSet& projectTargets)
{
  // add the target itself
  if (projectTargets.insert(target).second) {
    // This is the first time we have encountered the target.
    // Recursively follow its dependencies.
    TargetDependSet const& ts = this->GetTargetDirectDepends(target);
    for (TargetDependSet::const_iterator i = ts.begin(); i != ts.end(); ++i) {
      this->AddTargetDepends(*i, projectTargets);
    }
  }
}